

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O0

void __thiscall
minibag::Recorder::doQueue
          (Recorder *this,MessageEvent<const_miniros::topic_tools::ShapeShifter> *msg_event,
          string *topic,shared_ptr<miniros::Subscriber> *subscriber,shared_ptr<int> *count)

{
  Time _time;
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  reference __s;
  element_type *peVar4;
  MessageEvent<miniros::topic_tools::ShapeShifter_const> *in_RSI;
  long in_RDI;
  bool enabled;
  Time now;
  OutgoingMessage drop;
  scoped_lock<std::mutex> lock;
  OutgoingMessage out;
  Time rectime;
  char *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  TimeBase<miniros::Time,_miniros::Duration> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  byte in_stack_fffffffffffffe27;
  ConstPtr *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  OutgoingMessage *in_stack_fffffffffffffe38;
  uint32_t in_stack_fffffffffffffe40;
  uint32_t in_stack_fffffffffffffe44;
  uint in_stack_fffffffffffffe50;
  undefined8 local_159;
  TimeBase<miniros::Time,_miniros::Duration> local_130;
  TimeBase<miniros::Time,_miniros::Duration> local_128 [11];
  undefined8 local_d0;
  string local_50 [32];
  undefined8 local_30;
  MessageEvent<miniros::topic_tools::ShapeShifter_const> *local_10;
  
  local_10 = in_RSI;
  local_30 = miniros::Time::now();
  if ((*(byte *)(in_RDI + 7) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Received message on topic ");
    std::__shared_ptr_access<miniros::Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1d50e6);
    miniros::Subscriber::getTopic_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_50);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_50);
  }
  miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>::getMessage
            ((MessageEvent<const_miniros::topic_tools::ShapeShifter> *)in_stack_fffffffffffffe08);
  miniros::MessageEvent<miniros::topic_tools::ShapeShifter_const>::getConnectionHeaderPtr_abi_cxx11_
            (local_10);
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::shared_ptr((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffffe08);
  local_d0 = local_30;
  _time.super_TimeBase<miniros::Time,_miniros::Duration>.nsec = in_stack_fffffffffffffe44;
  _time.super_TimeBase<miniros::Time,_miniros::Duration>.sec = in_stack_fffffffffffffe40;
  OutgoingMessage::OutgoingMessage
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),_time);
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)0x1d51ec);
  std::shared_ptr<const_miniros::topic_tools::ShapeShifter>::~shared_ptr
            ((shared_ptr<const_miniros::topic_tools::ShapeShifter> *)0x1d51f9);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             (mutex_type *)in_stack_fffffffffffffe08);
  std::
  queue<minibag::OutgoingMessage,_std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>_>
  ::push((queue<minibag::OutgoingMessage,_std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>_>
          *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
         (value_type *)in_stack_fffffffffffffe08);
  std::
  __shared_ptr_access<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1d5242);
  uVar1 = miniros::topic_tools::ShapeShifter::size();
  *(ulong *)(in_RDI + 0x4c0) = (ulong)uVar1 + *(long *)(in_RDI + 0x4c0);
  while( true ) {
    uVar2 = in_stack_fffffffffffffe50 & 0xffffff;
    if (*(int *)(in_RDI + 0x70) != 0) {
      uVar2 = CONCAT13((ulong)*(uint *)(in_RDI + 0x70) < *(ulong *)(in_RDI + 0x4c0),
                       (int3)in_stack_fffffffffffffe50);
    }
    in_stack_fffffffffffffe50 = uVar2;
    if ((char)(in_stack_fffffffffffffe50 >> 0x18) == '\0') break;
    __s = std::
          queue<minibag::OutgoingMessage,_std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>_>
          ::front((queue<minibag::OutgoingMessage,_std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>_>
                   *)0x1d52bd);
    OutgoingMessage::OutgoingMessage
              ((OutgoingMessage *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (OutgoingMessage *)in_stack_fffffffffffffe08);
    std::
    queue<minibag::OutgoingMessage,_std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>_>
    ::pop((queue<minibag::OutgoingMessage,_std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>_>
           *)0x1d52ec);
    std::
    __shared_ptr_access<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d52fb);
    uVar2 = miniros::topic_tools::ShapeShifter::size();
    *(ulong *)(in_RDI + 0x4c0) = *(long *)(in_RDI + 0x4c0) - (ulong)uVar2;
    if ((*(byte *)(in_RDI + 6) & 1) == 0) {
      local_128[0] = (TimeBase<miniros::Time,_miniros::Duration>)miniros::Time::now();
      miniros::Duration::Duration
                ((Duration *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 (double)in_stack_fffffffffffffe18);
      local_130 = (TimeBase<miniros::Time,_miniros::Duration>)
                  miniros::TimeBase<miniros::Time,_miniros::Duration>::operator+
                            (in_stack_fffffffffffffe18,
                             (Duration *)
                             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      in_stack_fffffffffffffe27 =
           miniros::TimeBase<miniros::Time,_miniros::Duration>::operator>
                     (local_128,(Time *)&local_130);
      miniros::Duration::~Duration((Duration *)0x1d53c5);
      if ((in_stack_fffffffffffffe27 & 1) != 0) {
        if ((((byte)miniros::console::g_initialized ^ 0xff) & 1) != 0) {
          miniros::console::initialize();
        }
        if (((doQueue::loc.initialized_ ^ 0xffU) & 1) != 0) {
          in_stack_fffffffffffffe18 = (TimeBase<miniros::Time,_miniros::Duration> *)&local_159;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar1,in_stack_fffffffffffffe50),(char *)__s,
                     (allocator<char> *)CONCAT44(uVar2,in_stack_fffffffffffffe40));
          miniros::console::initializeLogLocation
                    (&doQueue::loc,(string *)((long)&local_159 + 1),Warn);
          std::__cxx11::string::~string((string *)((long)&local_159 + 1));
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
        }
        if (doQueue::loc.level_ != Warn) {
          miniros::console::setLogLocationLevel(&doQueue::loc,Warn);
          miniros::console::checkLogLocationEnabled(&doQueue::loc);
        }
        in_stack_fffffffffffffe17 = (doQueue::loc.logger_enabled_ & 1U) != 0;
        if ((bool)in_stack_fffffffffffffe17) {
          in_stack_fffffffffffffe08 =
               "rosbag record buffer exceeded.  Dropping oldest queued message.";
          miniros::console::print
                    ((FilterBase *)0x0,doQueue::loc.logger_,doQueue::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag/recorder.cpp"
                     ,0x111,
                     "void minibag::Recorder::doQueue(const miniros::MessageEvent<const miniros::topic_tools::ShapeShifter> &, const string &, shared_ptr<miniros::Subscriber>, shared_ptr<int>)"
                     ,"rosbag record buffer exceeded.  Dropping oldest queued message.");
        }
        *(TimeBase<miniros::Time,_miniros::Duration> *)(in_RDI + 0x528) = local_128[0];
      }
    }
    OutgoingMessage::~OutgoingMessage
              ((OutgoingMessage *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x1d5652);
  if ((*(byte *)(in_RDI + 6) & 1) == 0) {
    std::_V2::condition_variable_any::notify_all
              ((condition_variable_any *)
               CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  }
  peVar4 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  if (0 < *peVar4) {
    peVar4 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    *peVar4 = *peVar4 + -1;
    peVar4 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    if (*peVar4 == 0) {
      std::__shared_ptr_access<miniros::Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d56cd);
      miniros::Subscriber::shutdown();
      *(int *)(in_RDI + 0x448) = *(int *)(in_RDI + 0x448) + -1;
      if (*(int *)(in_RDI + 0x448) == 0) {
        miniros::shutdown();
      }
    }
  }
  OutgoingMessage::~OutgoingMessage
            ((OutgoingMessage *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  return;
}

Assistant:

void Recorder::doQueue(const miniros::MessageEvent<miniros::topic_tools::ShapeShifter const>& msg_event,
  string const& topic, shared_ptr<miniros::Subscriber> subscriber, shared_ptr<int> count)
{
  miniros::Time rectime = miniros::Time::now();

  if (options_.verbose)
    cout << "Received message on topic " << subscriber->getTopic() << endl;

  OutgoingMessage out(topic, msg_event.getMessage(), msg_event.getConnectionHeaderPtr(), rectime);

  {
    std::scoped_lock<std::mutex> lock(queue_mutex_);

    queue_->push(out);
    queue_size_ += out.msg->size();

    // Check to see if buffer has been exceeded
    while (options_.buffer_size > 0 && queue_size_ > options_.buffer_size) {
      OutgoingMessage drop = queue_->front();
      queue_->pop();
      queue_size_ -= drop.msg->size();

      if (!options_.snapshot) {
        miniros::Time now = miniros::Time::now();
        if (now > last_buffer_warn_ + miniros::Duration(5.0)) {
          MINIROS_WARN("rosbag record buffer exceeded.  Dropping oldest queued message.");
          last_buffer_warn_ = now;
        }
      }
    }
  }

  if (!options_.snapshot)
    queue_condition_.notify_all();

  // If we are book-keeping count, decrement and possibly shutdown
  if ((*count) > 0) {
    (*count)--;
    if ((*count) == 0) {
      subscriber->shutdown();

      num_subscribers_--;

      if (num_subscribers_ == 0)
        miniros::shutdown();
    }
  }
}